

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase915::run(TestCase915 *this)

{
  long lVar1;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar2;
  char *pcVar3;
  bool bVar4;
  void *pvVar5;
  TransformPromiseNodeBase *this_00;
  StringPtr cancelReason;
  DebugExpression<bool> _kjCondition_5;
  Canceler canceler;
  Promise<unsigned_int> nowI;
  Promise<unsigned_int> neverI;
  Promise<void> now;
  Promise<void> never;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_608;
  OwnPromiseNode local_600;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_5f8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_5f0;
  WaitScope waitScope;
  DebugExpression<bool> _kjCondition_4;
  undefined7 uStack_5c7;
  NullableValue<kj::Exception> _e932;
  DebugExpression<bool> _kjCondition;
  StringPtr local_238 [25];
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  canceler.list.ptr = (Maybe<kj::Canceler::AdapterBase_&>)(AdapterBase *)0x0;
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)&local_5f0);
  newAdaptedPromise<void,kj::Canceler::AdapterImpl<void>,kj::Canceler&,kj::Promise<void>>
            ((kj *)&never,&canceler,(Promise<void> *)&local_5f0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_5f0);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)&local_5f8);
  newAdaptedPromise<void,kj::Canceler::AdapterImpl<void>,kj::Canceler&,kj::Promise<void>>
            ((kj *)&now,&canceler,(Promise<void> *)&local_5f8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_5f8);
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)local_238);
  pcVar3 = local_238[0].content.ptr;
  lVar1 = *(long *)(local_238[0].content.ptr + 8);
  if (lVar1 == 0 || (ulong)((long)local_238[0].content.ptr - lVar1) < 0x28) {
    pvVar5 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_238,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:922:70)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00579d20;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    local_238[0].content.ptr[8] = '\0';
    local_238[0].content.ptr[9] = '\0';
    local_238[0].content.ptr[10] = '\0';
    local_238[0].content.ptr[0xb] = '\0';
    local_238[0].content.ptr[0xc] = '\0';
    local_238[0].content.ptr[0xd] = '\0';
    local_238[0].content.ptr[0xe] = '\0';
    local_238[0].content.ptr[0xf] = '\0';
    this_00 = (TransformPromiseNodeBase *)(local_238[0].content.ptr + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_238,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:922:70)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)(pcVar3 + -0x28) = &PTR_destroy_00579d20;
    *(long *)(pcVar3 + -0x20) = lVar1;
  }
  _e932.isSet = false;
  _e932._1_7_ = 0;
  __kjCondition = (PromiseNode *)0x0;
  local_600.ptr = &this_00->super_PromiseNode;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_e932);
  newAdaptedPromise<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>,kj::Canceler&,kj::Promise<unsigned_int>>
            ((kj *)&neverI,&canceler,(Promise<unsigned_int> *)&local_600);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_600);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_238);
  Promise<unsigned_int>::Promise((Promise<unsigned_int> *)&local_608,0x7b);
  newAdaptedPromise<unsigned_int,kj::Canceler::AdapterImpl<unsigned_int>,kj::Canceler&,kj::Promise<unsigned_int>>
            ((kj *)&nowI,&canceler,(Promise<unsigned_int> *)&local_608);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_608);
  _e932._0_8_ = anon_var_dwarf_4f636;
  _e932.field_1.value.ownFile.content.ptr = "run";
  _e932.field_1.value.ownFile.content.size_ = 0x230000039d;
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x39d;
  location.columnNumber = 0x23;
  bVar4 = kj::_::pollImpl((PromiseNode *)never.super_PromiseBase.node.ptr,&waitScope,location);
  OVar2.ptr = (PromiseNode *)__kjCondition;
  _kjCondition.value = !bVar4;
  if (bVar4 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x39d,ERROR,"\"failed: expected \" \"!never.poll(waitScope)\", _kjCondition",
               (char (*) [40])"failed: expected !never.poll(waitScope)",&_kjCondition);
  }
  _e932._0_8_ = anon_var_dwarf_4f636;
  _e932.field_1.value.ownFile.content.ptr = "run";
  _e932.field_1.value.ownFile.content.size_ = 0x200000039e;
  location_00.function = "run";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_00.lineNumber = 0x39e;
  location_00.columnNumber = 0x20;
  _kjCondition.value =
       kj::_::pollImpl((PromiseNode *)now.super_PromiseBase.node.ptr,&waitScope,location_00);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.value) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x39e,ERROR,"\"failed: expected \" \"now.poll(waitScope)\", _kjCondition",
               (char (*) [37])"failed: expected now.poll(waitScope)",&_kjCondition);
  }
  _e932._0_8_ = anon_var_dwarf_4f636;
  _e932.field_1.value.ownFile.content.ptr = "run";
  _e932.field_1.value.ownFile.content.size_ = 0x240000039f;
  location_01.function = "run";
  location_01.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_01.lineNumber = 0x39f;
  location_01.columnNumber = 0x24;
  bVar4 = kj::_::pollImpl((PromiseNode *)neverI.super_PromiseBase.node.ptr,&waitScope,location_01);
  _kjCondition.value = !bVar4;
  if (bVar4 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[41],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x39f,ERROR,"\"failed: expected \" \"!neverI.poll(waitScope)\", _kjCondition",
               (char (*) [41])"failed: expected !neverI.poll(waitScope)",&_kjCondition);
  }
  _e932._0_8_ = anon_var_dwarf_4f636;
  _e932.field_1.value.ownFile.content.ptr = "run";
  _e932.field_1.value.ownFile.content.size_ = 0x21000003a0;
  location_02.function = "run";
  location_02.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_02.lineNumber = 0x3a0;
  location_02.columnNumber = 0x21;
  _kjCondition.value =
       kj::_::pollImpl((PromiseNode *)nowI.super_PromiseBase.node.ptr,&waitScope,location_02);
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.value) {
    kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3a0,ERROR,"\"failed: expected \" \"nowI.poll(waitScope)\", _kjCondition",
               (char (*) [38])"failed: expected nowI.poll(waitScope)",&_kjCondition);
  }
  cancelReason.content.size_ = 7;
  cancelReason.content.ptr = "foobar";
  Canceler::cancel(&canceler,cancelReason);
  Promise<void>::wait(&never,&waitScope);
  __kjCondition = (ulong)OVar2.ptr & 0xffffffffffffff00;
  kj::_::NullableValue<kj::Exception>::NullableValue
            (&_e932,(NullableValue<kj::Exception> *)&_kjCondition);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  if (_e932.isSet == true) {
    __kjCondition = _e932.field_1.value.description.content.ptr;
    if (_e932.field_1.value.description.content.size_ == 0) {
      __kjCondition = (PromiseNode *)0x3fdd82;
    }
    local_238[0].content.ptr = "foobar";
    local_238[0].content.size_ = 7;
    bVar4 = StringPtr::contains((StringPtr *)&_kjCondition,local_238);
    __kjCondition_4 = (char *)CONCAT71(uStack_5c7,bVar4);
    if (kj::_::Debug::minSeverity < 3 && !bVar4) {
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x3a4,ERROR,
                 "\"failed: expected \" \"e.getDescription().contains(\\\"foobar\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                 ,(char (*) [55])"failed: expected e.getDescription().contains(\"foobar\")",
                 &_kjCondition_4,
                 (char (*) [56])"exception description didn\'t contain expected substring",
                 &_e932.field_1.value);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3a4,ERROR,"\"code did not throw: \" \"never.wait(waitScope)\"",
               (char (*) [42])"code did not throw: never.wait(waitScope)");
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&_e932);
  Promise<void>::wait(&now,&waitScope);
  __kjCondition_4 =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  Promise<unsigned_int>::wait(&neverI,&waitScope);
  __kjCondition = __kjCondition & 0xffffffffffffff00;
  kj::_::NullableValue<kj::Exception>::NullableValue
            (&_e932,(NullableValue<kj::Exception> *)&_kjCondition);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  if (_e932.isSet == true) {
    if (_e932.field_1.value.description.content.size_ == 0) {
      _e932.field_1.value.description.content.ptr = "";
    }
    local_238[0].content.ptr = "foobar";
    local_238[0].content.size_ = 7;
    __kjCondition = _e932.field_1.value.description.content.ptr;
    _kjCondition_5.value = StringPtr::contains((StringPtr *)&_kjCondition,local_238);
    if (kj::_::Debug::minSeverity < 3 && !_kjCondition_5.value) {
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x3a6,ERROR,
                 "\"failed: expected \" \"e.getDescription().contains(\\\"foobar\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                 ,(char (*) [55])"failed: expected e.getDescription().contains(\"foobar\")",
                 &_kjCondition_5,
                 (char (*) [56])"exception description didn\'t contain expected substring",
                 &_e932.field_1.value);
    }
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[43]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3a6,ERROR,"\"code did not throw: \" \"neverI.wait(waitScope)\"",
               (char (*) [43])"code did not throw: neverI.wait(waitScope)");
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&_e932);
  _e932._0_4_ = Promise<unsigned_int>::wait(&nowI,&waitScope);
  _e932._4_4_ = 0x7b;
  _e932.field_1.value.ownFile.content.ptr = " == ";
  _e932.field_1.value.ownFile.content.size_ = 5;
  _e932.field_1._16_1_ = _e932._0_4_ == 0x7b;
  if ((!(bool)_e932.field_1._16_1_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<unsigned_int,unsigned_int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3a7,ERROR,"\"failed: expected \" \"nowI.wait(waitScope) == 123u\", _kjCondition",
               (char (*) [46])"failed: expected nowI.wait(waitScope) == 123u",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_e932);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&nowI);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&neverI);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&now);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&never);
  Canceler::~Canceler(&canceler);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, Canceler) {
  EventLoop loop;
  WaitScope waitScope(loop);
  Canceler canceler;

  auto never = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE));
  auto now = canceler.wrap(kj::Promise<void>(kj::READY_NOW));
  auto neverI = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE).then([]() { return 123u; }));
  auto nowI = canceler.wrap(kj::Promise<uint>(123u));

  KJ_EXPECT(!never.poll(waitScope));
  KJ_EXPECT(now.poll(waitScope));
  KJ_EXPECT(!neverI.poll(waitScope));
  KJ_EXPECT(nowI.poll(waitScope));

  canceler.cancel("foobar");

  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("foobar", never.wait(waitScope));
  now.wait(waitScope);
  KJ_EXPECT_THROW_MESSAGE("foobar", neverI.wait(waitScope));
  KJ_EXPECT(nowI.wait(waitScope) == 123u);
}